

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.cpp
# Opt level: O0

Response Response::topology(vector<DatasetEntry,_std::allocator<DatasetEntry>_> *datasets)

{
  bool bVar1;
  reference pvVar2;
  reference this;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  Response RVar4;
  json index_entry;
  string type_name;
  IndexEntry *index;
  const_iterator __end2;
  const_iterator __begin2;
  vector<IndexEntry,_std::allocator<IndexEntry>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  indexes;
  DatasetEntry *dataset;
  const_iterator __end1;
  const_iterator __begin1;
  vector<DatasetEntry,_std::allocator<DatasetEntry>_> *__range1;
  json datasets_json;
  Response *r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffde0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffde8;
  reference in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  reference in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  reference in_stack_fffffffffffffe28;
  key_type *in_stack_fffffffffffffe48;
  reference in_stack_fffffffffffffe50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  char *in_stack_fffffffffffffe98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffea0;
  key_type local_130;
  string local_110 [32];
  reference local_f0;
  IndexEntry *local_e8;
  __normal_iterator<const_IndexEntry_*,_std::vector<IndexEntry,_std::allocator<IndexEntry>_>_>
  local_e0;
  vector<IndexEntry,_std::allocator<IndexEntry>_> *local_d8;
  reference local_b8;
  DatasetEntry *local_b0;
  __normal_iterator<const_DatasetEntry_*,_std::vector<DatasetEntry,_std::allocator<DatasetEntry>_>_>
  local_a8;
  undefined8 local_a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  allocator<char> local_39;
  string local_38 [39];
  byte local_11;
  undefined8 local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  Response((Response *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98.m_type = null;
  local_98._1_7_ = 0;
  local_98.m_value.object = (object_t *)0x0;
  this_00 = &local_98;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x208216);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
            (in_stack_fffffffffffffde0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdd8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x20823a);
  local_a0 = local_10;
  local_a8._M_current =
       (DatasetEntry *)
       std::vector<DatasetEntry,_std::allocator<DatasetEntry>_>::begin
                 ((vector<DatasetEntry,_std::allocator<DatasetEntry>_> *)in_stack_fffffffffffffdd8);
  local_b0 = (DatasetEntry *)
             std::vector<DatasetEntry,_std::allocator<DatasetEntry>_>::end
                       ((vector<DatasetEntry,_std::allocator<DatasetEntry>_> *)
                        in_stack_fffffffffffffdd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_DatasetEntry_*,_std::vector<DatasetEntry,_std::allocator<DatasetEntry>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<const_DatasetEntry_*,_std::vector<DatasetEntry,_std::allocator<DatasetEntry>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (!bVar1) break;
    local_b8 = __gnu_cxx::
               __normal_iterator<const_DatasetEntry_*,_std::vector<DatasetEntry,_std::allocator<DatasetEntry>_>_>
               ::operator*(&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x2082b4);
    local_d8 = &local_b8->indexes;
    local_e0._M_current =
         (IndexEntry *)
         std::vector<IndexEntry,_std::allocator<IndexEntry>_>::begin
                   ((vector<IndexEntry,_std::allocator<IndexEntry>_> *)in_stack_fffffffffffffdd8);
    local_e8 = (IndexEntry *)
               std::vector<IndexEntry,_std::allocator<IndexEntry>_>::end
                         ((vector<IndexEntry,_std::allocator<IndexEntry>_> *)
                          in_stack_fffffffffffffdd8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_IndexEntry_*,_std::vector<IndexEntry,_std::allocator<IndexEntry>_>_>
                          *)in_stack_fffffffffffffde0,
                         (__normal_iterator<const_IndexEntry_*,_std::vector<IndexEntry,_std::allocator<IndexEntry>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (!bVar1) break;
      local_f0 = __gnu_cxx::
                 __normal_iterator<const_IndexEntry_*,_std::vector<IndexEntry,_std::allocator<IndexEntry>_>_>
                 ::operator*(&local_e0);
      get_index_type_name_abi_cxx11_((IndexType)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      in_stack_fffffffffffffe48 = &local_130;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffde0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_unsigned_long_&,_unsigned_long,_0>
                (in_stack_fffffffffffffde0,(unsigned_long *)in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffe50 =
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffde0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::push_back(this_00,pvVar2);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(local_110);
      __gnu_cxx::
      __normal_iterator<const_IndexEntry_*,_std::vector<IndexEntry,_std::allocator<IndexEntry>_>_>::
      operator++(&local_e0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_unsigned_long_&,_unsigned_long,_0>
              (in_stack_fffffffffffffde0,(unsigned_long *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe28 =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(in_stack_fffffffffffffde0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_unsigned_long_&,_unsigned_long,_0>
              (in_stack_fffffffffffffde0,(unsigned_long *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe18 =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(in_stack_fffffffffffffde0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (in_stack_fffffffffffffde0,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffdd8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    in_stack_fffffffffffffdf0 =
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(in_stack_fffffffffffffde0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0);
    __gnu_cxx::
    __normal_iterator<const_DatasetEntry_*,_std::vector<DatasetEntry,_std::allocator<DatasetEntry>_>_>
    ::operator++(&local_a8);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(in_stack_fffffffffffffdf0,pvVar2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(this);
  local_11 = 1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(this);
  jVar3 = extraout_RDX;
  if ((local_11 & 1) == 0) {
    ~Response((Response *)0x208831);
    jVar3 = extraout_RDX_00;
  }
  RVar4.content.m_value.object = jVar3.object;
  RVar4.content._0_8_ = in_RDI;
  return (Response)RVar4.content;
}

Assistant:

Response Response::topology(const std::vector<DatasetEntry> &datasets) {
    Response r("topology");
    json datasets_json = std::map<std::string, std::string>{};
    for (auto &dataset : datasets) {
        std::vector<std::string> indexes;
        for (auto &index : dataset.indexes) {
            std::string type_name = get_index_type_name(index.type);
            json index_entry;
            index_entry["type"] = type_name;
            index_entry["size"] = index.size;
            datasets_json[dataset.id]["indexes"].push_back(index_entry);
        }
        datasets_json[dataset.id]["size"] = dataset.size;
        datasets_json[dataset.id]["file_count"] = dataset.file_count;
        datasets_json[dataset.id]["taints"] = dataset.taints;
    }
    r.content["result"]["datasets"] = datasets_json;
    return r;
}